

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleLockCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  char *pcVar5;
  ostream *poVar6;
  FILE *__stream;
  cmGlobalGenerator *this_00;
  ulong uVar7;
  string local_ba0;
  undefined1 local_b80 [8];
  ostringstream e_5;
  undefined1 local_a08 [8];
  string result;
  cmFileLockResult local_9c8;
  cmFileLockResult fileLockResult;
  cmFileLockPool *lockPool;
  undefined1 local_998 [8];
  ostringstream e_4;
  FILE *file;
  undefined1 local_7f8 [8];
  ostringstream e_3;
  undefined1 local_680 [8];
  string parentDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  string local_600;
  undefined1 local_5e0 [8];
  ostringstream e_2;
  string local_468;
  undefined1 local_448 [8];
  ostringstream e_1;
  unsigned_long local_2d0;
  long scanned;
  string local_2c0;
  allocator local_299;
  string local_298;
  string local_278;
  undefined1 local_258 [8];
  ostringstream e;
  allocator local_d9;
  string local_d8;
  char *local_b8;
  char *merr;
  undefined1 local_a8 [4];
  uint i;
  string path;
  allocator local_71;
  string local_70;
  unsigned_long local_50;
  unsigned_long timeout;
  string resultVariable;
  Guard guard;
  bool release;
  bool directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  resultVariable.field_2._M_local_buf[0xf] = '\0';
  resultVariable.field_2._M_local_buf[0xe] = '\0';
  resultVariable.field_2._8_4_ = 2;
  std::__cxx11::string::string((string *)&timeout);
  local_50 = 0xffffffffffffffff;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar3 < 2) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"sub-command LOCK requires at least two arguments.",&local_71);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_70,false);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    this_local._7_1_ = false;
    path.field_2._8_4_ = 1;
    goto LAB_0058529b;
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,1);
  std::__cxx11::string::string((string *)local_a8,(string *)pvVar4);
  for (merr._4_4_ = 2; uVar7 = (ulong)merr._4_4_,
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(args), uVar7 < sVar3; merr._4_4_ = merr._4_4_ + 1) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)merr._4_4_);
    bVar2 = std::operator==(pvVar4,"DIRECTORY");
    if (bVar2) {
      resultVariable.field_2._M_local_buf[0xf] = '\x01';
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)merr._4_4_);
      bVar2 = std::operator==(pvVar4,"RELEASE");
      if (bVar2) {
        resultVariable.field_2._M_local_buf[0xe] = '\x01';
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)merr._4_4_);
        bVar2 = std::operator==(pvVar4,"GUARD");
        if (bVar2) {
          merr._4_4_ = merr._4_4_ + 1;
          local_b8 = "expected FUNCTION, FILE or PROCESS after GUARD";
          uVar7 = (ulong)merr._4_4_;
          sVar3 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(args);
          pcVar5 = local_b8;
          if (sVar3 <= uVar7) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_d8,pcVar5,&local_d9);
            cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_d8,false);
            std::__cxx11::string::~string((string *)&local_d8);
            std::allocator<char>::~allocator((allocator<char> *)&local_d9);
            this_local._7_1_ = false;
            path.field_2._8_4_ = 1;
            goto LAB_0058527f;
          }
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)merr._4_4_);
          bVar2 = std::operator==(pvVar4,"FUNCTION");
          if (bVar2) {
            resultVariable.field_2._8_4_ = 0;
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)merr._4_4_);
            bVar2 = std::operator==(pvVar4,"FILE");
            if (bVar2) {
              resultVariable.field_2._8_4_ = 1;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)merr._4_4_);
              bVar2 = std::operator==(pvVar4,"PROCESS");
              if (!bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
                poVar6 = std::operator<<((ostream *)local_258,local_b8);
                poVar6 = std::operator<<(poVar6,", but got:\n  \"");
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,(ulong)merr._4_4_);
                poVar6 = std::operator<<(poVar6,(string *)pvVar4);
                std::operator<<(poVar6,"\".");
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_278,false);
                std::__cxx11::string::~string((string *)&local_278);
                this_local._7_1_ = false;
                path.field_2._8_4_ = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
                goto LAB_0058527f;
              }
              resultVariable.field_2._8_4_ = 2;
            }
          }
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,(ulong)merr._4_4_);
          bVar2 = std::operator==(pvVar4,"RESULT_VARIABLE");
          if (bVar2) {
            merr._4_4_ = merr._4_4_ + 1;
            uVar7 = (ulong)merr._4_4_;
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (sVar3 <= uVar7) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_298,"expected variable name after RESULT_VARIABLE",
                         &local_299);
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_298,false);
              std::__cxx11::string::~string((string *)&local_298);
              std::allocator<char>::~allocator((allocator<char> *)&local_299);
              this_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              goto LAB_0058527f;
            }
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)merr._4_4_);
            std::__cxx11::string::operator=((string *)&timeout,(string *)pvVar4);
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,(ulong)merr._4_4_);
            bVar2 = std::operator==(pvVar4,"TIMEOUT");
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5e0);
              std::operator<<((ostream *)local_5e0,
                              "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or TIMEOUT\n");
              poVar6 = std::operator<<((ostream *)local_5e0,"but got: \"");
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)merr._4_4_);
              poVar6 = std::operator<<(poVar6,(string *)pvVar4);
              std::operator<<(poVar6,"\".");
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_600,false);
              std::__cxx11::string::~string((string *)&local_600);
              this_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5e0);
              goto LAB_0058527f;
            }
            merr._4_4_ = merr._4_4_ + 1;
            uVar7 = (ulong)merr._4_4_;
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(args);
            if (sVar3 <= uVar7) {
              pcVar1 = (this->super_cmCommand).Makefile;
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_2c0,"expected timeout value after TIMEOUT",
                         (allocator *)((long)&scanned + 7));
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_2c0,false);
              std::__cxx11::string::~string((string *)&local_2c0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&scanned + 7));
              this_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              goto LAB_0058527f;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,(ulong)merr._4_4_);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            bVar2 = cmSystemTools::StringToLong(pcVar5,(long *)&local_2d0);
            if ((!bVar2) || ((long)local_2d0 < 0)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
              poVar6 = std::operator<<((ostream *)local_448,"TIMEOUT value \"");
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,(ulong)merr._4_4_);
              poVar6 = std::operator<<(poVar6,(string *)pvVar4);
              std::operator<<(poVar6,"\" is not an unsigned integer.");
              pcVar1 = (this->super_cmCommand).Makefile;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_468,false);
              std::__cxx11::string::~string((string *)&local_468);
              this_local._7_1_ = false;
              path.field_2._8_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
              goto LAB_0058527f;
            }
            local_50 = local_2d0;
          }
        }
      }
    }
  }
  if ((resultVariable.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)local_a8,"/cmake.lock");
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_a8);
  if (!bVar2) {
    pcVar5 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    std::operator+(&local_640,"/",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_620,pcVar5,&local_640);
    std::__cxx11::string::operator=((string *)local_a8,(string *)&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_640);
  }
  cmsys::SystemTools::CollapseFullPath((string *)((long)&parentDir.field_2 + 8),(string *)local_a8);
  std::__cxx11::string::operator=((string *)local_a8,(string *)(parentDir.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::~string((string *)(parentDir.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetParentDirectory((string *)local_680,(string *)local_a8);
  bVar2 = cmsys::SystemTools::MakeDirectory((string *)local_680);
  if (bVar2) {
    __stream = (FILE *)cmsys::SystemTools::Fopen((string *)local_a8,"w");
    if (__stream == (FILE *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
      poVar6 = std::operator<<((ostream *)local_998,"file\n  \"");
      poVar6 = std::operator<<(poVar6,(string *)local_a8);
      std::operator<<(poVar6,"\"\ncreation failed (check permissions).");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&lockPool,false);
      std::__cxx11::string::~string((string *)&lockPool);
      cmSystemTools::SetFatalErrorOccured();
      this_local._7_1_ = false;
      path.field_2._8_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
    }
    else {
      fclose(__stream);
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      fileLockResult = (cmFileLockResult)cmGlobalGenerator::GetFileLockPool(this_00);
      local_9c8 = cmFileLockResult::MakeOk();
      if ((resultVariable.field_2._M_local_buf[0xe] & 1U) == 0) {
        if (resultVariable.field_2._8_4_ == 0) {
          local_9c8 = cmFileLockPool::LockFunctionScope
                                ((cmFileLockPool *)fileLockResult,(string *)local_a8,local_50);
        }
        else if (resultVariable.field_2._8_4_ == 1) {
          local_9c8 = cmFileLockPool::LockFileScope
                                ((cmFileLockPool *)fileLockResult,(string *)local_a8,local_50);
        }
        else {
          if (resultVariable.field_2._8_4_ != 2) {
            cmSystemTools::SetFatalErrorOccured();
            this_local._7_1_ = false;
            path.field_2._8_4_ = 1;
            goto LAB_00585263;
          }
          result.field_2._8_8_ =
               cmFileLockPool::LockProcessScope
                         ((cmFileLockPool *)fileLockResult,(string *)local_a8,local_50);
          local_9c8 = (cmFileLockResult)result.field_2._8_8_;
        }
      }
      else {
        local_9c8 = cmFileLockPool::Release((cmFileLockPool *)fileLockResult,(string *)local_a8);
      }
      cmFileLockResult::GetOutputMessage_abi_cxx11_((string *)local_a08,&local_9c8);
      uVar7 = std::__cxx11::string::empty();
      if (((uVar7 & 1) == 0) || (bVar2 = cmFileLockResult::IsOk(&local_9c8), bVar2)) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddDefinition(pcVar1,(string *)&timeout,pcVar5);
        }
        this_local._7_1_ = true;
        path.field_2._8_4_ = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b80);
        poVar6 = std::operator<<((ostream *)local_b80,"error locking file\n  \"");
        poVar6 = std::operator<<(poVar6,(string *)local_a8);
        poVar6 = std::operator<<(poVar6,"\"\n");
        poVar6 = std::operator<<(poVar6,(string *)local_a08);
        std::operator<<(poVar6,".");
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_ba0,false);
        std::__cxx11::string::~string((string *)&local_ba0);
        cmSystemTools::SetFatalErrorOccured();
        this_local._7_1_ = false;
        path.field_2._8_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b80);
      }
      std::__cxx11::string::~string((string *)local_a08);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7f8);
    poVar6 = std::operator<<((ostream *)local_7f8,"directory\n  \"");
    poVar6 = std::operator<<(poVar6,(string *)local_680);
    std::operator<<(poVar6,"\"\ncreation failed ");
    std::operator<<((ostream *)local_7f8,"(check permissions).");
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)&file,false);
    std::__cxx11::string::~string((string *)&file);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = false;
    path.field_2._8_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7f8);
  }
LAB_00585263:
  std::__cxx11::string::~string((string *)local_680);
LAB_0058527f:
  std::__cxx11::string::~string((string *)local_a8);
LAB_0058529b:
  std::__cxx11::string::~string((string *)&timeout);
  return this_local._7_1_;
}

Assistant:

bool cmFileCommand::HandleLockCommand(
  std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Default values
  bool directory = false;
  bool release = false;
  enum Guard {
    GUARD_FUNCTION,
    GUARD_FILE,
    GUARD_PROCESS
  };
  Guard guard = GUARD_PROCESS;
  std::string resultVariable;
  unsigned long timeout = static_cast<unsigned long>(-1);

  // Parse arguments
  if(args.size() < 2)
    {
    this->Makefile->IssueMessage(
        cmake::FATAL_ERROR,
        "sub-command LOCK requires at least two arguments.");
    return false;
    }

  std::string path = args[1];
  for (unsigned i = 2; i < args.size(); ++i)
    {
    if (args[i] == "DIRECTORY")
      {
      directory = true;
      }
    else if (args[i] == "RELEASE")
      {
      release = true;
      }
    else if (args[i] == "GUARD")
      {
      ++i;
      const char* merr = "expected FUNCTION, FILE or PROCESS after GUARD";
      if (i >= args.size())
        {
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, merr);
        return false;
        }
      else
        {
        if (args[i] == "FUNCTION")
          {
          guard = GUARD_FUNCTION;
          }
        else if (args[i] == "FILE")
          {
          guard = GUARD_FILE;
          }
        else if (args[i] == "PROCESS")
          {
          guard = GUARD_PROCESS;
          }
        else
          {
          std::ostringstream e;
          e << merr << ", but got:\n  \"" << args[i] << "\".";
          this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
          return false;
          }
        }
      }
    else if (args[i] == "RESULT_VARIABLE")
      {
      ++i;
      if (i >= args.size())
        {
        this->Makefile->IssueMessage(
            cmake::FATAL_ERROR,
            "expected variable name after RESULT_VARIABLE");
        return false;
        }
      resultVariable = args[i];
      }
    else if (args[i] == "TIMEOUT")
      {
      ++i;
      if (i >= args.size())
        {
        this->Makefile->IssueMessage(
            cmake::FATAL_ERROR,
            "expected timeout value after TIMEOUT");
        return false;
        }
      long scanned;
      if(!cmSystemTools::StringToLong(args[i].c_str(), &scanned)
         || scanned < 0)
        {
        std::ostringstream e;
        e << "TIMEOUT value \"" << args[i] << "\" is not an unsigned integer.";
        this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
        return false;
        }
      timeout = static_cast<unsigned long>(scanned);
      }
    else
      {
      std::ostringstream e;
      e << "expected DIRECTORY, RELEASE, GUARD, RESULT_VARIABLE or TIMEOUT\n";
      e << "but got: \"" << args[i] << "\".";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return false;
      }
    }

  if (directory)
    {
    path += "/cmake.lock";
    }

  if (!cmsys::SystemTools::FileIsFullPath(path))
    {
    path = this->Makefile->GetCurrentSourceDirectory() + ("/" + path);
    }

  // Unify path (remove '//', '/../', ...)
  path = cmSystemTools::CollapseFullPath(path);

  // Create file and directories if needed
  std::string parentDir = cmSystemTools::GetParentDirectory(path);
  if (!cmSystemTools::MakeDirectory(parentDir))
    {
    std::ostringstream e;
    e << "directory\n  \"" << parentDir << "\"\ncreation failed ";
    e << "(check permissions).";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }
  FILE *file = cmsys::SystemTools::Fopen(path, "w");
  if (!file)
    {
    std::ostringstream e;
    e << "file\n  \"" << path << "\"\ncreation failed (check permissions).";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }
  fclose(file);

  // Actual lock/unlock
  cmFileLockPool& lockPool = this->Makefile->GetGlobalGenerator()
                                           ->GetFileLockPool();

  cmFileLockResult fileLockResult(cmFileLockResult::MakeOk());
  if (release)
    {
    fileLockResult = lockPool.Release(path);
    }
  else
    {
    switch (guard)
      {
      case GUARD_FUNCTION:
        fileLockResult = lockPool.LockFunctionScope(path, timeout);
        break;
      case GUARD_FILE:
        fileLockResult = lockPool.LockFileScope(path, timeout);
        break;
      case GUARD_PROCESS:
        fileLockResult = lockPool.LockProcessScope(path, timeout);
        break;
      default:
        cmSystemTools::SetFatalErrorOccured();
        return false;
      }
    }

  const std::string result = fileLockResult.GetOutputMessage();

  if (resultVariable.empty() && !fileLockResult.IsOk())
    {
    std::ostringstream e;
    e << "error locking file\n  \"" << path << "\"\n" << result << ".";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  if (!resultVariable.empty())
    {
    this->Makefile->AddDefinition(resultVariable, result.c_str());
    }

  return true;
#else
  static_cast<void>(args);
  this->SetError("sub-command LOCK not implemented in bootstrap cmake");
  return false;
#endif
}